

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_types.cpp
# Opt level: O3

void duckdb::TestVectorTypesFun::RegisterFunction(BuiltinFunctions *set)

{
  named_parameter_type_map_t *__ht;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  mapped_type *pmVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  initializer_list<duckdb::LogicalType> __l;
  __alloc_node_gen_t __alloc_node_gen;
  LogicalType local_418;
  key_type local_400;
  vector<duckdb::LogicalType,_true> local_3e0;
  string local_3c8;
  undefined4 local_3a8;
  undefined4 uStack_3a4;
  undefined4 uStack_3a0;
  undefined4 uStack_39c;
  TableFunction local_390;
  undefined1 local_1d8 [144];
  __buckets_ptr local_148;
  size_type local_140;
  __node_base local_138;
  size_type local_130;
  _Prime_rehash_policy local_128;
  __node_base_ptr local_118;
  undefined1 local_110 [216];
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  TableFunctionInitialization local_28;
  
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"test_vector_types","");
  LogicalType::LogicalType((LogicalType *)&local_400,ANY);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_400;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3e0,__l,
             (allocator_type *)&local_418);
  TableFunction::TableFunction
            (&local_390,&local_3c8,&local_3e0,TestVectorTypesFunction,TestVectorTypesBind,
             TestVectorTypesInit,(table_function_init_local_t)0x0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3e0);
  LogicalType::~LogicalType((LogicalType *)&local_400);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  LogicalType::LogicalType((LogicalType *)&local_400,ANY);
  _Var2._M_pi = local_390.super_SimpleNamedParameterFunction.super_SimpleFunction.varargs.type_info_
                .internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  peVar1 = local_390.super_SimpleNamedParameterFunction.super_SimpleFunction.varargs.type_info_.
           internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_390.super_SimpleNamedParameterFunction.super_SimpleFunction.varargs.id_ =
       (LogicalTypeId)local_400._M_dataplus._M_p;
  local_390.super_SimpleNamedParameterFunction.super_SimpleFunction.varargs.physical_type_ =
       local_400._M_dataplus._M_p._1_1_;
  local_390.super_SimpleNamedParameterFunction.super_SimpleFunction.varargs.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_400._M_string_length;
  local_390.super_SimpleNamedParameterFunction.super_SimpleFunction.varargs.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_400.field_2._M_allocated_capacity;
  local_400._M_string_length = (size_type)peVar1;
  local_400.field_2._M_allocated_capacity = (size_type)_Var2._M_pi;
  LogicalType::~LogicalType((LogicalType *)&local_400);
  LogicalType::LogicalType(&local_418,BOOLEAN);
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"all_flat","");
  __ht = &local_390.super_SimpleNamedParameterFunction.named_parameters;
  pmVar3 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)__ht,&local_400);
  _Var2._M_pi = local_418.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  peVar1 = local_418.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pmVar3->id_ = local_418.id_;
  pmVar3->physical_type_ = local_418.physical_type_;
  uVar4 = *(undefined4 *)
           &(pmVar3->type_info_).internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar5 = *(undefined4 *)
           ((long)&(pmVar3->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4)
  ;
  uVar6 = *(undefined4 *)
           &(pmVar3->type_info_).internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  uVar7 = *(undefined4 *)
           ((long)&(pmVar3->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi + 4);
  (pmVar3->type_info_).internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (pmVar3->type_info_).internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_418.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_418.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this = (pmVar3->type_info_).internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pmVar3->type_info_).internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (pmVar3->type_info_).internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_3a8 = uVar4;
    uStack_3a4 = uVar5;
    uStack_3a0 = uVar6;
    uStack_39c = uVar7;
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    uVar4 = local_3a8;
    uVar5 = uStack_3a4;
    uVar6 = uStack_3a0;
    uVar7 = uStack_39c;
  }
  _Var2._M_pi = local_418.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  local_418.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)CONCAT44(uVar5,uVar4);
  local_418.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       uVar7;
  local_418.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
       uVar6;
  if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p);
  }
  LogicalType::~LogicalType(&local_418);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_1d8,(SimpleFunction *)&local_390);
  local_400._M_dataplus._M_p = (pointer)&local_148;
  local_1d8._0_8_ = &PTR__SimpleNamedParameterFunction_0243ff38;
  local_148 = (__buckets_ptr)0x0;
  local_140 = local_390.super_SimpleNamedParameterFunction.named_parameters._M_h._M_bucket_count;
  local_138._M_nxt = (_Hash_node_base *)0x0;
  local_130 = local_390.super_SimpleNamedParameterFunction.named_parameters._M_h._M_element_count;
  local_128._M_max_load_factor =
       local_390.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy.
       _M_max_load_factor;
  local_128._4_4_ =
       local_390.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy._4_4_;
  local_128._M_next_resize =
       local_390.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy.
       _M_next_resize;
  local_118 = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_400._M_dataplus._M_p,&__ht->_M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
              *)&local_400);
  local_1d8._0_8_ = &PTR__TableFunction_02435168;
  switchD_012b9b0d::default(local_110,&local_390.bind,0xd6);
  local_38 = local_390.function_info.internal.
             super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Stack_30._M_pi =
       local_390.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_390.function_info.internal.
  super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_390.function_info.internal.
  super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28 = local_390.global_initialization;
  BuiltinFunctions::AddFunction(set,(TableFunction *)local_1d8);
  local_1d8._0_8_ = &PTR__TableFunction_02435168;
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_1d8);
  local_390.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__TableFunction_02435168;
  if (local_390.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_390.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_390.super_SimpleNamedParameterFunction);
  return;
}

Assistant:

void TestVectorTypesFun::RegisterFunction(BuiltinFunctions &set) {
	TableFunction test_vector_types("test_vector_types", {LogicalType::ANY}, TestVectorTypesFunction,
	                                TestVectorTypesBind, TestVectorTypesInit);
	test_vector_types.varargs = LogicalType::ANY;
	test_vector_types.named_parameters["all_flat"] = LogicalType::BOOLEAN;

	set.AddFunction(std::move(test_vector_types));
}